

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * __thiscall Peeps::PeepRedundant(Peeps *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  JITTimeFunctionBody *this_00;
  Instr *this_01;
  Opnd *pOVar7;
  
  OVar1 = instr->m_opcode;
  if (((OVar1 == ADD) || (OVar1 == SUB)) || (OVar1 == OR)) {
    if ((instr->m_src1 == (Opnd *)0x0) || (pOVar7 = instr->m_src2, pOVar7 == (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,1099,"(instr->GetSrc1() && instr->GetSrc2())",
                         "instr->GetSrc1() && instr->GetSrc2()");
      if (!bVar3) goto LAB_0061dd57;
      *puVar5 = 0;
      pOVar7 = instr->m_src2;
    }
    OVar4 = IR::Opnd::GetKind(pOVar7);
    if (OVar4 == OpndKindIntConst) {
      pOVar7 = instr->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar7);
      if (OVar4 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar3) goto LAB_0061dd57;
        *puVar5 = 0;
      }
      if (pOVar7[1]._vptr_Opnd == (_func_int **)0x0) {
LAB_0061dd3c:
        pIVar6 = instr->m_next;
        IR::Instr::Remove(instr);
        return pIVar6;
      }
    }
    OVar1 = instr->m_opcode;
  }
  if (((OVar1 == NOP) && (instr->m_dst != (Opnd *)0x0)) &&
     (OVar4 = IR::Opnd::GetKind(instr->m_dst), OVar4 == OpndKindReg)) {
    pOVar7 = instr->m_dst;
    OVar4 = IR::Opnd::GetKind(pOVar7);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0061dd57;
      *puVar5 = 0;
    }
    pIVar6 = instr;
    if (*(byte *)((long)&pOVar7[1].m_valueType.field_0.bits + 1) == 3) {
      do {
        pIVar6 = IR::Instr::GetPrevRealInstrOrLabel(pIVar6);
        if (pIVar6->m_opcode == CALL) {
          this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
          if (bVar3) goto LAB_0061dd3c;
        }
        else if (pIVar6->m_opcode == IMUL) goto LAB_0061dd3c;
      } while ((6 < pIVar6->m_kind) ||
              (this_01 = instr, (0x68U >> (pIVar6->m_kind & 0x1f) & 1) == 0));
      do {
        this_01 = IR::Instr::GetNextRealInstrOrLabel(this_01);
        OVar1 = this_01->m_opcode;
        if (OVar1 == 0x413) goto LAB_0061dd3c;
      } while ((((this_01->m_kind != InstrKindBranch) && (this_01->m_kind != InstrKindExit)) &&
               (2 < OVar1 - 0x23)) && (1 < OVar1 - 0x173));
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x481,"(found)","edx = NOP without an IMUL or DIV");
      if (!bVar3) {
LAB_0061dd57:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return instr;
}

Assistant:

IR::Instr *
Peeps::PeepRedundant(IR::Instr *instr)
{
    IR::Instr *retInstr = instr;

    if (instr->m_opcode == Js::OpCode::ADD || instr->m_opcode == Js::OpCode::SUB || instr->m_opcode == Js::OpCode::OR)
    {
        Assert(instr->GetSrc1() && instr->GetSrc2());
        if( (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->AsIntConstOpnd()->GetValue() == 0))
        {
            // remove instruction
            retInstr = instr->m_next;
            instr->Remove();
            return retInstr;
        }
    }
#if _M_IX86
    RegNum edx = RegEDX;
#else
    RegNum edx = RegRDX;
#endif
    if (instr->m_opcode == Js::OpCode::NOP && instr->GetDst() != NULL
        && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)
    {
        // dummy def used for non-32bit ovf check for IMUL
        // check edx is not killed between IMUL and edx = NOP, then remove the NOP
        bool found = false;
        IR::Instr *nopInstr = instr;
        do
        {
            instr = instr->GetPrevRealInstrOrLabel();
            if (
                instr->m_opcode == Js::OpCode::IMUL ||
                (instr->m_opcode == Js::OpCode::CALL && this->func->GetJITFunctionBody()->IsWasmFunction())
            )
            {
                found = true;
                break;
            }
        } while(!instr->StartsBasicBlock());

        if (found)
        {
            retInstr = nopInstr->m_next;
            nopInstr->Remove();
        }
        else
        {
            instr = nopInstr;
            do
            {
                instr = instr->GetNextRealInstrOrLabel();
                if (instr->m_opcode == Js::OpCode::DIV)
                {
                    found = true;
                    retInstr = nopInstr->m_next;
                    nopInstr->Remove();
                    break;
                }
            } while (!instr->EndsBasicBlock());

            AssertMsg(found, "edx = NOP without an IMUL or DIV");
        }
    }
    return retInstr;
}